

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapDeepOcean(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  byte bVar3;
  int oceans;
  int v11;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int local_58;
  long local_50;
  long local_48;
  int local_4;
  
  lVar2 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar2,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        local_58 = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 1) * lVar2) * 4);
        iVar1 = isShallowOcean(local_58);
        if (iVar1 != 0) {
          iVar1 = isShallowOcean(*(int *)(in_RSI + (local_48 + 1 + local_50 * lVar2) * 4));
          bVar3 = iVar1 != 0;
          iVar1 = isShallowOcean(*(int *)(in_RSI + (local_48 + 2 + (local_50 + 1) * lVar2) * 4));
          if (iVar1 != 0) {
            bVar3 = bVar3 + 1;
          }
          iVar1 = isShallowOcean(*(int *)(in_RSI + (local_48 + (local_50 + 1) * lVar2) * 4));
          if (iVar1 != 0) {
            bVar3 = bVar3 + 1;
          }
          iVar1 = isShallowOcean(*(int *)(in_RSI + (local_48 + 1 + (local_50 + 2) * lVar2) * 4));
          if (iVar1 != 0) {
            bVar3 = bVar3 + 1;
          }
          if (3 < bVar3) {
            switch(local_58) {
            case 0:
              local_58 = 0x18;
              break;
            default:
              local_58 = 0x18;
              break;
            case 10:
              local_58 = 0x32;
              break;
            case 0x2c:
              local_58 = 0x2f;
              break;
            case 0x2d:
              local_58 = 0x30;
              break;
            case 0x2e:
              local_58 = 0x31;
            }
          }
        }
        *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = local_58;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapDeepOcean(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[(i+1) + (j+1)*pW];

            if (isShallowOcean(v11))
            {
                // count adjacent oceans
                int oceans = 0;
                if (isShallowOcean(out[(i+1) + (j+0)*pW])) oceans++;
                if (isShallowOcean(out[(i+2) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+0) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+1) + (j+2)*pW])) oceans++;

                if (oceans >= 4)
                {
                    switch (v11)
                    {
                    case warm_ocean:
                        v11 = deep_warm_ocean;
                        break;
                    case lukewarm_ocean:
                        v11 = deep_lukewarm_ocean;
                        break;
                    case ocean:
                        v11 = deep_ocean;
                        break;
                    case cold_ocean:
                        v11 = deep_cold_ocean;
                        break;
                    case frozen_ocean:
                        v11 = deep_frozen_ocean;
                        break;
                    default:
                        v11 = deep_ocean;
                    }
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}